

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

void * get_base_component(ecs_world_t *world,ecs_stage_t *stage,ecs_entity_info_t *info,
                         ecs_entity_t component)

{
  ecs_vector_t *vector;
  _Bool _Var1;
  int32_t iVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  ecs_entity_info_t prefab_info;
  ecs_entity_info_t local_50;
  
  vector = (ecs_vector_t *)**(undefined8 **)&stage->id;
  pvVar3 = _ecs_vector_first(vector,8,0x10);
  iVar5 = -1;
  pvVar7 = (void *)0x0;
  do {
    iVar2 = ecs_vector_count(vector);
    pvVar4 = _ecs_vector_first(vector,8,0x10);
    lVar6 = (long)iVar5;
    do {
      lVar6 = lVar6 + 1;
      if (iVar2 <= lVar6) {
        iVar5 = -1;
        break;
      }
      iVar5 = (int)lVar6;
    } while (*(char *)((long)pvVar4 + lVar6 * 8 + 7) != -2);
    if (iVar5 == -1) {
      return pvVar7;
    }
    pvVar4 = pvVar3;
    _Var1 = ecs_get_info(world,*(ulong *)((long)pvVar3 + (long)iVar5 * 8) & 0xffffffffffffff,
                         &local_50);
    if (_Var1) {
      pvVar7 = (void *)0x0;
      if ((local_50.table != (ecs_table_t *)0x0) &&
         (pvVar7 = get_component(&local_50,(ecs_entity_t)info), pvVar7 == (void *)0x0)) {
        pvVar7 = get_base_component(world,(ecs_stage_t *)&local_50,info,(ecs_entity_t)pvVar4);
      }
    }
    else {
      pvVar7 = (void *)0x0;
    }
    if (pvVar7 != (void *)0x0) {
      return pvVar7;
    }
  } while( true );
}

Assistant:

static
void* get_base_component(
    ecs_world_t * world,
    ecs_stage_t * stage,
    ecs_entity_info_t * info,
    ecs_entity_t component)
{
    ecs_type_t type = info->table->type;
    ecs_entity_t *type_buffer = ecs_vector_first(type, ecs_entity_t);
    int32_t p = -1;
    void *ptr = NULL;

    while (!ptr && (p = find_prefab(type, p)) != -1) {
        ecs_entity_t prefab = type_buffer[p] & ECS_COMPONENT_MASK;
        ecs_entity_info_t prefab_info;
        if (ecs_get_info(world, prefab, &prefab_info) && prefab_info.table) {
            ptr = get_component(&prefab_info, component);
            if (!ptr) {
                ptr = get_base_component(
                    world, stage, &prefab_info, component);
            }
        }
    }

    return ptr;
}